

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O3

value YAML::Utils::ComputeStringFormat
                (string *str,EMITTER_MANIP strFormat,value flowType,bool escapeNonAscii)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  RegEx *pRVar5;
  RegEx *pRVar6;
  undefined8 *puVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  RegEx local_f8;
  undefined1 *local_d8;
  RegEx local_d0;
  RegEx local_b0;
  RegEx local_90;
  RegEx local_70;
  RegEx local_50;
  
  if (strFormat != Literal) {
    if (strFormat != SingleQuoted) {
      if (strFormat != Auto) {
        return DoubleQuoted;
      }
      bVar3 = IsNullString(str);
      if (bVar3) {
        return DoubleQuoted;
      }
      if (flowType == Flow) {
        pRVar5 = Exp::PlainScalarInFlow();
      }
      else {
        pRVar5 = Exp::PlainScalar();
      }
      iVar4 = RegEx::Match(pRVar5,str);
      if (iVar4 < 0) {
        return DoubleQuoted;
      }
      if ((str->_M_string_length != 0) &&
         ((str->_M_dataplus)._M_p[str->_M_string_length - 1] == ' ')) {
        return DoubleQuoted;
      }
      if ((anonymous_namespace)::
          IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
          disallowed_flow == '\0') {
        local_d8 = &(anonymous_namespace)::
                    IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
                    disallowed_flow;
        iVar4 = __cxa_guard_acquire();
        if (iVar4 != 0) {
          pRVar5 = Exp::EndScalarInFlow();
          pRVar6 = Exp::BlankOrBreak();
          Exp::Comment();
          operator+(&local_b0,pRVar6,&local_d0);
          operator|(&local_90,pRVar5,&local_b0);
          pRVar5 = Exp::NotPrintable();
          operator|(&local_70,&local_90,pRVar5);
          pRVar5 = Exp::Utf8_ByteOrderMark();
          operator|(&local_50,&local_70,pRVar5);
          pRVar5 = Exp::Break();
          operator|(&local_f8,&local_50,pRVar5);
          pRVar5 = Exp::Tab();
          operator|((RegEx *)(anonymous_namespace)::
                             IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)
                             ::disallowed_flow,&local_f8,pRVar5);
          __cxa_atexit(RegEx::~RegEx,
                       (anonymous_namespace)::
                       IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
                       disallowed_flow,&__dso_handle);
          std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_f8.m_params);
          std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_50.m_params);
          std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_70.m_params);
          std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_90.m_params);
          std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_b0.m_params);
          std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_d0.m_params);
          (anonymous_namespace)::
          IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
          disallowed_flow =
               (anonymous_namespace)::
               IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
               disallowed_flow;
          __cxa_guard_release(&(anonymous_namespace)::
                               IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)
                               ::disallowed_flow);
        }
      }
      if ((anonymous_namespace)::
          IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
          disallowed_block == '\0') {
        local_d8 = &(anonymous_namespace)::
                    IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
                    disallowed_block;
        iVar4 = __cxa_guard_acquire();
        if (iVar4 != 0) {
          pRVar5 = Exp::EndScalar();
          pRVar6 = Exp::BlankOrBreak();
          Exp::Comment();
          operator+(&local_b0,pRVar6,&local_d0);
          operator|(&local_90,pRVar5,&local_b0);
          pRVar5 = Exp::NotPrintable();
          operator|(&local_70,&local_90,pRVar5);
          pRVar5 = Exp::Utf8_ByteOrderMark();
          operator|(&local_50,&local_70,pRVar5);
          pRVar5 = Exp::Break();
          operator|(&local_f8,&local_50,pRVar5);
          pRVar5 = Exp::Tab();
          operator|((RegEx *)(anonymous_namespace)::
                             IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)
                             ::disallowed_block,&local_f8,pRVar5);
          __cxa_atexit(RegEx::~RegEx,
                       (anonymous_namespace)::
                       IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
                       disallowed_block,&__dso_handle);
          std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_f8.m_params);
          std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_50.m_params);
          std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_70.m_params);
          std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_90.m_params);
          std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_b0.m_params);
          std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_d0.m_params);
          (anonymous_namespace)::
          IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
          disallowed_block =
               (anonymous_namespace)::
               IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
               disallowed_block;
          __cxa_guard_release(&(anonymous_namespace)::
                               IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)
                               ::disallowed_block);
        }
      }
      puVar7 = &(anonymous_namespace)::
                IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
                disallowed_block;
      if (flowType == Flow) {
        puVar7 = &(anonymous_namespace)::
                  IsValidPlainScalar(std::__cxx11::string_const&,YAML::FlowType::value,bool)::
                  disallowed_flow;
      }
      pRVar5 = (RegEx *)*puVar7;
      local_f8._0_8_ = (str->_M_dataplus)._M_p;
      local_f8.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)str->_M_string_length;
      local_f8.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (local_f8.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        do {
          bVar3 = RegEx::Matches<YAML::StringCharSource>(pRVar5,(StringCharSource *)&local_f8);
          if (bVar3) {
            return DoubleQuoted;
          }
          if ((escapeNonAscii) &&
             (*(char *)(local_f8._0_8_ +
                       (long)local_f8.m_params.
                             super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
                             super__Vector_impl_data._M_finish) < '\0')) {
            return DoubleQuoted;
          }
          local_f8.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((long)&(local_f8.m_params.
                                 super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                                 _M_impl.super__Vector_impl_data._M_finish)->m_op + 1);
        } while (local_f8.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                 _M_impl.super__Vector_impl_data._M_finish <
                 local_f8.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      }
      return Plain;
    }
    pcVar8 = (str->_M_dataplus)._M_p;
    uVar2 = str->_M_string_length;
    pcVar1 = pcVar8 + uVar2;
    pcVar9 = pcVar8;
    if (0 < (long)uVar2 >> 2) {
      pcVar9 = pcVar8 + (uVar2 & 0xfffffffffffffffc);
      lVar10 = ((long)uVar2 >> 2) + 1;
      pcVar8 = pcVar8 + 3;
      do {
        if ((pcVar8[-3] == '\n') || (pcVar8[-3] < '\0' && escapeNonAscii)) {
          pcVar8 = pcVar8 + -3;
          goto LAB_0070954a;
        }
        if ((pcVar8[-2] == '\n') || (pcVar8[-2] < '\0' && escapeNonAscii)) {
          pcVar8 = pcVar8 + -2;
          goto LAB_0070954a;
        }
        if ((pcVar8[-1] == '\n') || (pcVar8[-1] < '\0' && escapeNonAscii)) {
          pcVar8 = pcVar8 + -1;
          goto LAB_0070954a;
        }
        if ((*pcVar8 == '\n') || (*pcVar8 < '\0' && escapeNonAscii)) goto LAB_0070954a;
        lVar10 = lVar10 + -1;
        pcVar8 = pcVar8 + 4;
      } while (1 < lVar10);
    }
    lVar10 = (long)pcVar1 - (long)pcVar9;
    if (lVar10 != 1) {
      pcVar8 = pcVar9;
      if (lVar10 != 2) {
        pcVar8 = pcVar1;
        if ((lVar10 != 3) || (pcVar8 = pcVar9, *pcVar9 == '\n' || *pcVar9 < '\0' && escapeNonAscii))
        goto LAB_0070954a;
        pcVar8 = pcVar9 + 1;
      }
      if (*pcVar8 == '\n' || *pcVar8 < '\0' && escapeNonAscii) goto LAB_0070954a;
      pcVar9 = pcVar8 + 1;
    }
    pcVar8 = pcVar1;
    if (escapeNonAscii) {
      pcVar8 = pcVar9;
    }
    if (-1 < *pcVar9) {
      pcVar8 = pcVar1;
    }
    if (*pcVar9 == '\n') {
      pcVar8 = pcVar9;
    }
LAB_0070954a:
    return (pcVar8 != pcVar1) + SingleQuoted;
  }
  if (flowType == Flow) {
    return DoubleQuoted;
  }
  pcVar8 = (str->_M_dataplus)._M_p;
  uVar2 = str->_M_string_length;
  pcVar1 = pcVar8 + uVar2;
  pcVar9 = pcVar8;
  if (0 < (long)uVar2 >> 2) {
    pcVar9 = pcVar8 + (uVar2 & 0xfffffffffffffffc);
    lVar10 = ((long)uVar2 >> 2) + 1;
    pcVar8 = pcVar8 + 3;
    do {
      if (pcVar8[-3] < '\0' && escapeNonAscii) {
        pcVar8 = pcVar8 + -3;
        goto LAB_00709566;
      }
      if (pcVar8[-2] < '\0' && escapeNonAscii) {
        pcVar8 = pcVar8 + -2;
        goto LAB_00709566;
      }
      if (pcVar8[-1] < '\0' && escapeNonAscii) {
        pcVar8 = pcVar8 + -1;
        goto LAB_00709566;
      }
      if (*pcVar8 < '\0' && escapeNonAscii) goto LAB_00709566;
      lVar10 = lVar10 + -1;
      pcVar8 = pcVar8 + 4;
    } while (1 < lVar10);
  }
  lVar10 = (long)pcVar1 - (long)pcVar9;
  if (lVar10 != 1) {
    if (lVar10 != 2) {
      if (lVar10 != 3) {
        return Literal;
      }
      pcVar8 = pcVar9;
      if (*pcVar9 < '\0' && escapeNonAscii) goto LAB_00709566;
      pcVar9 = pcVar9 + 1;
    }
    pcVar8 = pcVar9;
    if (*pcVar9 < '\0' && escapeNonAscii) goto LAB_00709566;
    pcVar9 = pcVar9 + 1;
  }
  pcVar8 = pcVar1;
  if (escapeNonAscii) {
    pcVar8 = pcVar9;
  }
  if (-1 < *pcVar9) {
    pcVar8 = pcVar1;
  }
LAB_00709566:
  if (pcVar8 == pcVar1) {
    return Literal;
  }
  return DoubleQuoted;
}

Assistant:

StringFormat::value ComputeStringFormat(const std::string& str,
                                        EMITTER_MANIP strFormat,
                                        FlowType::value flowType,
                                        bool escapeNonAscii) {
  switch (strFormat) {
    case Auto:
      if (IsValidPlainScalar(str, flowType, escapeNonAscii)) {
        return StringFormat::Plain;
      }
      return StringFormat::DoubleQuoted;
    case SingleQuoted:
      if (IsValidSingleQuotedScalar(str, escapeNonAscii)) {
        return StringFormat::SingleQuoted;
      }
      return StringFormat::DoubleQuoted;
    case DoubleQuoted:
      return StringFormat::DoubleQuoted;
    case Literal:
      if (IsValidLiteralScalar(str, flowType, escapeNonAscii)) {
        return StringFormat::Literal;
      }
      return StringFormat::DoubleQuoted;
    default:
      break;
  }

  return StringFormat::DoubleQuoted;
}